

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall ON_PolylineCurve::ChangeDimension(ON_PolylineCurve *this,int desired_dimension)

{
  uint uVar1;
  ON_3dPoint *pOVar2;
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if (((desired_dimension & 0xfffffffeU) == 2) && (this->m_dim != desired_dimension)) {
    ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    auVar3 = _DAT_0069b120;
    uVar1 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_count;
    if (desired_dimension == 2) {
      iVar4 = 2;
      if (0 < (int)uVar1) {
        pOVar2 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        if ((pOVar2->x != -1.23432101234321e+308) || (NAN(pOVar2->x))) {
          lVar5 = (ulong)uVar1 - 1;
          auVar6._8_4_ = (int)lVar5;
          auVar6._0_8_ = lVar5;
          auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
          lVar5 = 0;
          auVar6 = auVar6 ^ _DAT_0069b120;
          auVar10 = _DAT_0069b170;
          do {
            auVar9 = auVar10 ^ auVar3;
            if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                        auVar6._4_4_ < auVar9._4_4_) & 1)) {
              *(undefined8 *)((long)&pOVar2->z + lVar5) = 0;
            }
            if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
                auVar9._12_4_ <= auVar6._12_4_) {
              *(undefined8 *)((long)&pOVar2[1].z + lVar5) = 0;
            }
            lVar8 = auVar10._8_8_;
            auVar10._0_8_ = auVar10._0_8_ + 2;
            auVar10._8_8_ = lVar8 + 2;
            lVar5 = lVar5 + 0x30;
          } while ((ulong)(uVar1 + 1 >> 1) * 0x30 != lVar5);
        }
      }
    }
    else {
      iVar4 = 3;
      if (0 < (int)uVar1) {
        pOVar2 = (this->m_pline).super_ON_3dPointArray.super_ON_SimpleArray<ON_3dPoint>.m_a;
        if ((((pOVar2->x != -1.23432101234321e+308) || (NAN(pOVar2->x))) &&
            (pOVar2->z == -1.23432101234321e+308)) && (!NAN(pOVar2->z))) {
          lVar5 = (ulong)uVar1 - 1;
          auVar7._8_4_ = (int)lVar5;
          auVar7._0_8_ = lVar5;
          auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
          lVar5 = 0;
          auVar7 = auVar7 ^ _DAT_0069b120;
          auVar9 = _DAT_0069b170;
          do {
            auVar10 = auVar9 ^ auVar3;
            if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                        auVar7._4_4_ < auVar10._4_4_) & 1)) {
              *(undefined8 *)((long)&pOVar2->z + lVar5) = 0;
            }
            if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
                auVar10._12_4_ <= auVar7._12_4_) {
              *(undefined8 *)((long)&pOVar2[1].z + lVar5) = 0;
            }
            lVar8 = auVar9._8_8_;
            auVar9._0_8_ = auVar9._0_8_ + 2;
            auVar9._8_8_ = lVar8 + 2;
            lVar5 = lVar5 + 0x30;
          } while ((ulong)(uVar1 + 1 >> 1) * 0x30 != lVar5);
        }
      }
    }
    this->m_dim = iVar4;
  }
  return (desired_dimension & 0xfffffffeU) == 2;
}

Assistant:

bool ON_PolylineCurve::ChangeDimension( int desired_dimension )
{
  bool rc = (desired_dimension>=2 && desired_dimension<=3);

  if ( rc && m_dim != desired_dimension )
  {
  	DestroyCurveTree();
    int i, count = m_pline.Count();
    if ( 2 == desired_dimension )
    {
      if ( count > 0 )
      {
        // 7 April 2003 Dale Lear:
        //   If x coord of first point is set, then
        //   zero all z coords.  
        if ( ON_UNSET_VALUE != m_pline[0].x )
        {
          for ( i = 0; i < count; i++ )
            m_pline[i].z = 0.0;
        }
      }
      m_dim = 2;
    }
    else 
    {
      if ( count > 0 )
      {
        // 7 April 2003 Dale Lear:
        //   If first point x coord is set and z is unset, then
        //   zero all z coords.  
        if ( ON_UNSET_VALUE != m_pline[0].x && ON_UNSET_VALUE == m_pline[0].z )
        {
          for ( i = 0; i < count; i++ )
            m_pline[i].z = 0.0;
        }
      }
      m_dim = 3;
    }
  }

  return rc;
}